

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSize(CodeGeneratorRequest *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  FileDescriptorProto *value;
  UnknownFieldSet *pUVar4;
  int local_1c;
  int local_18;
  int i_1;
  int i;
  int total_size;
  CodeGeneratorRequest *this_local;
  
  i_1 = 0;
  if (((this->_has_bits_[0] & 0x1fe) != 0) && (bVar1 = has_parameter(this), bVar1)) {
    psVar3 = parameter_abi_cxx11_(this);
    iVar2 = internal::WireFormatLite::StringSize(psVar3);
    i_1 = iVar2 + 1;
  }
  iVar2 = file_to_generate_size(this);
  i_1 = iVar2 + i_1;
  for (local_18 = 0; iVar2 = file_to_generate_size(this), local_18 < iVar2; local_18 = local_18 + 1)
  {
    psVar3 = file_to_generate_abi_cxx11_(this,local_18);
    iVar2 = internal::WireFormatLite::StringSize(psVar3);
    i_1 = iVar2 + i_1;
  }
  iVar2 = proto_file_size(this);
  i_1 = iVar2 + i_1;
  for (local_1c = 0; iVar2 = proto_file_size(this), local_1c < iVar2; local_1c = local_1c + 1) {
    value = proto_file(this,local_1c);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FileDescriptorProto>
                      (value);
    i_1 = iVar2 + i_1;
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    i_1 = iVar2 + i_1;
  }
  this->_cached_size_ = i_1;
  return i_1;
}

Assistant:

int CodeGeneratorRequest::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string parameter = 2;
    if (has_parameter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->parameter());
    }

  }
  // repeated string file_to_generate = 1;
  total_size += 1 * this->file_to_generate_size();
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->file_to_generate(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  total_size += 1 * this->proto_file_size();
  for (int i = 0; i < this->proto_file_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->proto_file(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}